

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O1

void __thiscall cmCTestP4::LoadRevisions(cmCTestP4 *this)

{
  pointer pcVar1;
  cmCTest *this_00;
  int iVar2;
  char *pcVar3;
  pointer pbVar4;
  vector<const_char_*,_std::allocator<const_char_*>_> p4_describe;
  vector<const_char_*,_std::allocator<const_char_*>_> p4_changes;
  string range;
  OutputLogger errDescribe;
  OutputLogger err;
  ChangesParser out;
  ostringstream cmCTestLog_msg;
  vector<const_char_*,_std::allocator<const_char_*>_> local_538;
  vector<const_char_*,_std::allocator<const_char_*>_> local_518;
  _func_int **local_4f8 [2];
  _func_int *local_4e8 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_4d8;
  OutputLogger local_4d0;
  OutputLogger local_490;
  ChangesParser local_450;
  undefined1 local_338 [248];
  char *local_240;
  char *local_170;
  vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_> local_150;
  Revision local_130;
  
  local_518.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (char **)0x0;
  local_518.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (char **)0x0;
  local_518.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (char **)0x0;
  SetP4Options(this,&local_518);
  local_4f8[0] = local_4e8;
  pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.SourceDirectory._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_4f8,pcVar1,
             pcVar1 + (this->super_cmCTestGlobalVC).super_cmCTestVC.SourceDirectory._M_string_length
            );
  std::__cxx11::string::append((char *)local_4f8);
  iVar2 = std::__cxx11::string::compare((char *)&(this->super_cmCTestGlobalVC).OldRevision);
  if (iVar2 != 0) {
    iVar2 = std::__cxx11::string::compare((char *)&(this->super_cmCTestGlobalVC).NewRevision);
    if (iVar2 != 0) {
      pcVar3 = (char *)std::__cxx11::string::append((char *)local_4f8);
      pcVar3 = (char *)std::__cxx11::string::_M_append
                                 (pcVar3,(ulong)(this->super_cmCTestGlobalVC).OldRevision.
                                                _M_dataplus._M_p);
      pcVar3 = (char *)std::__cxx11::string::append(pcVar3);
      std::__cxx11::string::_M_append
                (pcVar3,(ulong)(this->super_cmCTestGlobalVC).NewRevision._M_dataplus._M_p);
      local_338._0_8_ = "changes";
      if (local_518.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_518.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                  ((vector<char_const*,std::allocator<char_const*>> *)&local_518,
                   (iterator)
                   local_518.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                   .super__Vector_impl_data._M_finish,(char **)local_338);
      }
      else {
        *local_518.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
         super__Vector_impl_data._M_finish = "changes";
        local_518.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_518.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      local_338._0_8_ = local_4f8[0];
      if (local_518.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_518.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                  ((vector<char_const*,std::allocator<char_const*>> *)&local_518,
                   (iterator)
                   local_518.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                   .super__Vector_impl_data._M_finish,(char **)local_338);
      }
      else {
        *local_518.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
         super__Vector_impl_data._M_finish = (char *)local_4f8[0];
        local_518.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_518.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      local_338._0_8_ = (_func_int **)0x0;
      if (local_518.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_518.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                  ((vector<char_const*,std::allocator<char_const*>> *)&local_518,
                   (iterator)
                   local_518.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                   .super__Vector_impl_data._M_finish,(char **)local_338);
      }
      else {
        *local_518.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
         super__Vector_impl_data._M_finish = (char *)0x0;
        local_518.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_518.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      ChangesParser::ChangesParser(&local_450,this,"p4_changes-out> ");
      cmProcessTools::OutputLogger::OutputLogger
                (&local_490,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"p4_changes-err> ");
      local_4d8 = &this->ChangeLists;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase_at_end(local_4d8,
                        (this->ChangeLists).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      cmCTestVC::RunChild((cmCTestVC *)this,
                          local_518.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,(OutputParser *)&local_450,
                          (OutputParser *)&local_490,(char *)0x0);
      pbVar4 = (this->ChangeLists).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((this->ChangeLists).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != pbVar4) {
        local_538.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start = (char **)0x0;
        local_538.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (char **)0x0;
        local_538.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (char **)0x0;
        if (pbVar4 != (local_4d8->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start) {
          do {
            SetP4Options(this,&local_538);
            local_338._0_8_ = "describe";
            if (local_538.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_538.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                        ((vector<char_const*,std::allocator<char_const*>> *)&local_538,
                         (iterator)
                         local_538.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(char **)local_338);
            }
            else {
              *local_538.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_finish = "describe";
              local_538.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_538.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                   .super__Vector_impl_data._M_finish + 1;
            }
            local_338._0_8_ = "-s";
            if (local_538.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_538.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                        ((vector<char_const*,std::allocator<char_const*>> *)&local_538,
                         (iterator)
                         local_538.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(char **)local_338);
            }
            else {
              *local_538.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_finish = "-s";
              local_538.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_538.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                   .super__Vector_impl_data._M_finish + 1;
            }
            local_338._0_8_ = pbVar4[-1]._M_dataplus._M_p;
            if (local_538.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_538.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                        ((vector<char_const*,std::allocator<char_const*>> *)&local_538,
                         (iterator)
                         local_538.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(char **)local_338);
            }
            else {
              *local_538.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_finish = (char *)local_338._0_8_;
              local_538.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_538.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                   .super__Vector_impl_data._M_finish + 1;
            }
            local_338._0_8_ = (_func_int **)0x0;
            if (local_538.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_538.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                        ((vector<char_const*,std::allocator<char_const*>> *)&local_538,
                         (iterator)
                         local_538.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(char **)local_338);
            }
            else {
              *local_538.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_finish = (char *)0x0;
              local_538.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_538.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                   .super__Vector_impl_data._M_finish + 1;
            }
            DescribeParser::DescribeParser((DescribeParser *)local_338,this,"p4_describe-out> ");
            cmProcessTools::OutputLogger::OutputLogger
                      (&local_4d0,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
                       "p4_describe-err> ");
            cmCTestVC::RunChild((cmCTestVC *)this,
                                local_538.
                                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                _M_impl.super__Vector_impl_data._M_start,(OutputParser *)local_338,
                                (OutputParser *)&local_4d0,(char *)0x0);
            local_4d0.super_LineParser.super_OutputParser._vptr_OutputParser =
                 (_func_int **)&PTR__LineParser_006bc790;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4d0.super_LineParser.Line._M_dataplus._M_p !=
                &local_4d0.super_LineParser.Line.field_2) {
              operator_delete(local_4d0.super_LineParser.Line._M_dataplus._M_p,
                              local_4d0.super_LineParser.Line.field_2._M_allocated_capacity + 1);
            }
            local_338._0_8_ = &PTR__DescribeParser_006bb320;
            cmCTestVC::Revision::~Revision(&local_130);
            std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::~vector
                      (&local_150);
            if (local_170 != (char *)0x0) {
              operator_delete__(local_170);
            }
            if (local_240 != (char *)0x0) {
              operator_delete__(local_240);
            }
            local_338._0_8_ = &PTR__LineParser_006bc790;
            if ((undefined1 *)local_338._24_8_ != local_338 + 0x28) {
              operator_delete((void *)local_338._24_8_,local_338._40_8_ + 1);
            }
            pbVar4 = pbVar4 + -1;
          } while (pbVar4 != (local_4d8->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_538.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start != (char **)0x0) {
          operator_delete(local_538.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_538.
                                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_538.
                                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
      local_490.super_LineParser.super_OutputParser._vptr_OutputParser =
           (_func_int **)&PTR__LineParser_006bc790;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_490.super_LineParser.Line._M_dataplus._M_p !=
          &local_490.super_LineParser.Line.field_2) {
        operator_delete(local_490.super_LineParser.Line._M_dataplus._M_p,
                        local_490.super_LineParser.Line.field_2._M_allocated_capacity + 1);
      }
      local_450.super_LineParser.super_OutputParser._vptr_OutputParser =
           (_func_int **)&PTR__ChangesParser_006bb2d8;
      if (local_450.RegexIdentify.program != (char *)0x0) {
        operator_delete__(local_450.RegexIdentify.program);
      }
      local_450.super_LineParser.super_OutputParser._vptr_OutputParser =
           (_func_int **)&PTR__LineParser_006bc790;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450.super_LineParser.Line._M_dataplus._M_p !=
          &local_450.super_LineParser.Line.field_2) {
        operator_delete(local_450.super_LineParser.Line._M_dataplus._M_p,
                        local_450.super_LineParser.Line.field_2._M_allocated_capacity + 1);
      }
      goto LAB_002d9211;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_338);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_338,"   At least one of the revisions ",0x21);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_338,"is unknown. No repository changes will be reported.\n",0x34);
  this_00 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(this_00,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestP4.cxx"
               ,0x1b1,(char *)local_450.super_LineParser.super_OutputParser._vptr_OutputParser,false
              );
  if (local_450.super_LineParser.super_OutputParser._vptr_OutputParser !=
      (_func_int **)&local_450.super_LineParser.Prefix) {
    operator_delete(local_450.super_LineParser.super_OutputParser._vptr_OutputParser,
                    (ulong)(local_450.super_LineParser.Prefix + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_338);
  std::ios_base::~ios_base((ios_base *)(local_338 + 0x70));
LAB_002d9211:
  if (local_4f8[0] != local_4e8) {
    operator_delete(local_4f8[0],(ulong)(local_4e8[0] + 1));
  }
  if (local_518.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (char **)0x0) {
    operator_delete(local_518.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_518.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_518.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void cmCTestP4::LoadRevisions()
{
  std::vector<char const*> p4_changes;
  SetP4Options(p4_changes);

  // Use 'p4 changes ...@old,new' to get a list of changelists
  std::string range = this->SourceDirectory + "/...";

  // If any revision is unknown it means we couldn't contact the server.
  // Do not process updates
  if(this->OldRevision == "<unknown>" || this->NewRevision == "<unknown>")
    {
    cmCTestLog(this->CTest, HANDLER_OUTPUT, "   At least one of the revisions "
               << "is unknown. No repository changes will be reported.\n");
    return;
    }

  range.append("@").append(this->OldRevision)
       .append(",").append(this->NewRevision);

  p4_changes.push_back("changes");
  p4_changes.push_back(range.c_str());
  p4_changes.push_back(0);

  ChangesParser out(this, "p4_changes-out> ");
  OutputLogger err(this->Log, "p4_changes-err> ");

  ChangeLists.clear();
  this->RunChild(&p4_changes[0], &out, &err);

  if(ChangeLists.empty())
      return;

  //p4 describe -s ...@1111111,2222222
  std::vector<char const*> p4_describe;
  for(std::vector<std::string>::reverse_iterator i = ChangeLists.rbegin();
      i != ChangeLists.rend(); ++i)
    {
    SetP4Options(p4_describe);
    p4_describe.push_back("describe");
    p4_describe.push_back("-s");
    p4_describe.push_back(i->c_str());
    p4_describe.push_back(0);

    DescribeParser outDescribe(this, "p4_describe-out> ");
    OutputLogger errDescribe(this->Log, "p4_describe-err> ");
    this->RunChild(&p4_describe[0], &outDescribe, &errDescribe);
    }
}